

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserPafTest_CompressedParseInChunks_Test::TestBody
          (BioparserPafTest_CompressedParseInChunks_Test *this)

{
  Parser<bioparser::test::PafOverlap> *pPVar1;
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  t;
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  local_40;
  
  std::__cxx11::string::string((string *)&t,"sample.paf.gz",(allocator *)&local_40);
  BioparserPafTest::Setup(&this->super_BioparserPafTest,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  pPVar1 = (this->super_BioparserPafTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&t,pPVar1,0x400,1);
  while( true ) {
    if (t.
        super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        t.
        super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    std::
    vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>
    ::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>*,std::vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>>>,void>
              ((vector<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>,std::allocator<std::unique_ptr<bioparser::test::PafOverlap,std::default_delete<bioparser::test::PafOverlap>>>>
                *)&(this->super_BioparserPafTest).o,
               (this->super_BioparserPafTest).o.
               super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pPVar1 = (this->super_BioparserPafTest).p._M_t.
             super___uniq_ptr_impl<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
             .super__Head_base<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_false>.
             _M_head_impl;
    (*pPVar1->_vptr_Parser[2])(&local_40,pPVar1,0x400,1);
    std::
    vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
    ::_M_move_assign(&t,&local_40);
    std::
    vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
    ::~vector(&local_40);
  }
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::~vector(&t);
  BioparserPafTest::Check(&this->super_BioparserPafTest);
  return;
}

Assistant:

TEST_F(BioparserPafTest, CompressedParseInChunks) {
  Setup("sample.paf.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}